

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void fillInHeader(header_old_cpio *header,stat *st,string *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  __off_t _Var5;
  runtime_error *this;
  undefined1 auVar6 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  header->c_magic = 0x71c7;
  header->c_dev = (unsigned_short)st->st_dev;
  header->c_ino = (unsigned_short)st->st_ino;
  uVar4 = st->st_mode;
  header->c_mode = (unsigned_short)uVar4;
  uVar1 = st->st_uid;
  uVar2 = st->st_gid;
  auVar6._4_4_ = uVar2;
  auVar6._0_4_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6 = pshuflw(auVar6,auVar6,0xe8);
  header->c_uid = (short)auVar6._0_4_;
  header->c_gid = (short)((uint)auVar6._0_4_ >> 0x10);
  header->c_nlink = (unsigned_short)st->st_nlink;
  header->c_rdev = (unsigned_short)st->st_rdev;
  uVar3 = (uint)(st->st_mtim).tv_sec;
  *(uint *)header->c_mtime = uVar3 >> 0x10 | uVar3 << 0x10;
  header->c_namesize = (short)(int)filename->_M_string_length + 1;
  uVar4 = (uVar4 & 0xf000) - 0x1000 >> 0xc;
  if (uVar4 < 0xc) {
    if ((0x82bU >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x280U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0010522a;
      _Var5 = st->st_size;
      header->c_filesize[0] = (unsigned_short)((ulong)_Var5 >> 0x10);
    }
    else {
      header->c_filesize[0] = 0;
      _Var5 = 0;
    }
    header->c_filesize[1] = (unsigned_short)_Var5;
    return;
  }
LAB_0010522a:
  this = (runtime_error *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Unknown filetype","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_00108d50;
  *(undefined4 *)(this + 0x10) = 1;
  __cxa_throw(this,&CpioException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void fillInHeader(header_old_cpio& header, struct stat& st, const string& filename)
{
	header.c_magic = 0x71c7;
	header.c_dev = (unsigned short) st.st_dev;
	header.c_ino = (unsigned short) st.st_ino;
	header.c_mode = (unsigned short) st.st_mode;
	header.c_uid = (unsigned short) st.st_uid;
	header.c_gid = (unsigned short) st.st_gid;
	header.c_nlink = (unsigned short) st.st_nlink;
	header.c_rdev = (unsigned short) st.st_rdev;
	header.c_mtime[0] = (unsigned short) (st.st_mtime >> sizeof(unsigned short)*8);
	header.c_mtime[1] = (unsigned short) (st.st_mtime);
	header.c_namesize = (unsigned short) (filename.length() + 1);
	switch (header.c_mode & CP_IFMT) {
	    case S_IFDIR:
		case S_IFCHR:
	    case S_IFBLK:
	    case S_IFSOCK:
	    case S_IFIFO:
	    	header.c_filesize[0] = 0;
	    	header.c_filesize[1] = 0;
	    	break;
	    case S_IFLNK:
	    case S_IFREG:
			header.c_filesize[0] = (unsigned short) (st.st_size >> sizeof(unsigned short)*8); // for filesizes <= 2Gb
			header.c_filesize[1] = (unsigned short) (st.st_size);
			break;
		default:
			throw CpioException(CpioException::InvalidInputFileToArchive, "Unknown filetype");
	}
}